

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::ICmpInst>::run(TypedDeleter<LLVMBC::ICmpInst> *this)

{
  TypedDeleter<LLVMBC::ICmpInst> *this_local;
  
  ICmpInst::~ICmpInst(this->ptr);
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}